

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqarray.h
# Opt level: O2

bool __thiscall SQArray::Set(SQArray *this,SQInteger nidx,SQObjectPtr *val)

{
  ulong uVar1;
  
  uVar1 = (ulong)(this->_values)._size;
  if ((ulong)nidx < uVar1) {
    SQObjectPtr::operator=((this->_values)._vals + nidx,val);
  }
  return (ulong)nidx < uVar1;
}

Assistant:

bool Set(const SQInteger nidx,const SQObjectPtr &val)
    {
        if((SQUnsignedInteger)nidx<(SQUnsignedInteger)_values.size()){
            _values[nidx]=val;
            VT_TRACE(nidx, val, _ss(this)->_root_vm);
            return true;
        }
        else return false;
    }